

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O2

void __thiscall t_json_generator::end_object(t_json_generator *this)

{
  int *piVar1;
  ostream *poVar2;
  string sStack_38;
  
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  poVar2 = std::operator<<((ostream *)&this->f_json_,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&sStack_38,&this->super_t_generator);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_38);
  std::operator<<(poVar2,"}");
  std::__cxx11::string::~string((string *)&sStack_38);
  std::deque<bool,_std::allocator<bool>_>::pop_back(&(this->comma_needed_).c);
  return;
}

Assistant:

void t_json_generator::end_object() {
  indent_down();
  f_json_ << endl << indent() << "}";
  comma_needed_.pop();
}